

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddAbs.c
# Opt level: O3

DdNode * Cudd_addExistAbstract(DdManager *manager,DdNode *f,DdNode *cube)

{
  int *piVar1;
  DdNode *pDVar2;
  
  two = cuddUniqueConst(manager,2.0);
  if (two != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)two & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    if (((ulong)cube & 1) == 0) {
      pDVar2 = cube;
      do {
        if (manager->one == pDVar2) {
          do {
            manager->reordered = 0;
            pDVar2 = cuddAddExistAbstractRecur(manager,f,cube);
          } while (manager->reordered == 1);
          if (pDVar2 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(manager,two);
            return (DdNode *)0x0;
          }
          piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(manager,two);
          piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          return pDVar2;
        }
      } while (((pDVar2->index != 0x7fffffff) && ((pDVar2->type).kids.E == manager->zero)) &&
              (pDVar2 = (pDVar2->type).kids.T, ((ulong)pDVar2 & 1) == 0));
    }
    fwrite("Error: Can only abstract cubes",0x1e,1,(FILE *)manager->err);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_addExistAbstract(
  DdManager * manager,
  DdNode * f,
  DdNode * cube)
{
    DdNode *res;

    two = cuddUniqueConst(manager,(CUDD_VALUE_TYPE) 2);
    if (two == NULL) return(NULL);
    cuddRef(two);

    if (addCheckPositiveCube(manager, cube) == 0) {
        (void) fprintf(manager->err,"Error: Can only abstract cubes");
        return(NULL);
    }

    do {
        manager->reordered = 0;
        res = cuddAddExistAbstractRecur(manager, f, cube);
    } while (manager->reordered == 1);

    if (res == NULL) {
        Cudd_RecursiveDeref(manager,two);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(manager,two);
    cuddDeref(res);

    return(res);

}